

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::_::concat<kj::String,kj::StringPtr&,kj::String>
          (String *__return_storage_ptr__,_ *this,String *params,StringPtr *params_1,
          String *params_2)

{
  size_t sVar1;
  char *target;
  initializer_list<unsigned_long> nums;
  long local_38;
  long local_30;
  long local_28;
  
  local_38 = *(long *)(this + 8) + -1;
  if (*(long *)(this + 8) == 0) {
    local_38 = 0;
  }
  local_30 = (params->content).size_ - 1;
  sVar1 = (params_1->content).size_;
  local_28 = sVar1 - 1;
  if (sVar1 == 0) {
    local_28 = 0;
  }
  nums._M_len = (size_type)params;
  nums._M_array = (iterator)0x3;
  sVar1 = sum((_ *)&local_38,nums);
  heapString(__return_storage_ptr__,sVar1);
  target = (char *)(__return_storage_ptr__->content).size_;
  if (target != (char *)0x0) {
    target = (__return_storage_ptr__->content).ptr;
  }
  fill<kj::String,kj::StringPtr&,kj::String>
            (target,(String *)this,(StringPtr *)params,(String *)params_1);
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}